

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O2

bool llvm::DWARFDebugLoclists::dumpLocationList
               (DWARFDataExtractor *Data,uint64_t *Offset,uint16_t Version,raw_ostream *OS,
               uint64_t BaseAddr,MCRegisterInfo *MRI,DWARFUnit *U,DIDumpOptions DumpOpts,uint Indent
               )

{
  undefined4 uVar1;
  raw_ostream *this;
  undefined6 in_register_00000012;
  Error *E_00;
  MCRegisterInfo *pMVar2;
  ulong uVar3;
  bool bVar4;
  StringRef SVar5;
  StringRef SVar6;
  function_ref<bool_(const_llvm::DWARFDebugLoclists::Entry_&)> F;
  string local_a0;
  DWARFUnit **local_80;
  DIDumpOptions *local_78;
  uint *local_70;
  MCRegisterInfo **local_68;
  uint64_t local_60;
  uint64_t BaseAddr_local;
  MCRegisterInfo *MRI_local;
  ulong local_48;
  uint local_3c;
  char *local_38;
  Error E;
  
  uVar1 = DumpOpts._20_4_;
  uVar3 = CONCAT62(in_register_00000012,Version) & 0xffffffff;
  MRI_local = (MCRegisterInfo *)0x0;
  bVar4 = DumpOpts.Verbose == true;
  DumpOpts._20_4_ = uVar1;
  local_60 = BaseAddr;
  BaseAddr_local = (uint64_t)MRI;
  if (bVar4) {
    SVar5 = dwarf::LocListEncodingString(0);
    SVar6 = dwarf::LocListEncodingString(1);
    local_3c = (uint)CONCAT62(in_register_00000012,Version);
    pMVar2 = (MCRegisterInfo *)SVar6.Length;
    if ((MCRegisterInfo *)SVar6.Length < (MCRegisterInfo *)SVar5.Length) {
      pMVar2 = (MCRegisterInfo *)SVar5.Length;
    }
    SVar5 = dwarf::LocListEncodingString(2);
    if (pMVar2 <= (MCRegisterInfo *)SVar5.Length) {
      pMVar2 = (MCRegisterInfo *)SVar5.Length;
    }
    SVar5 = dwarf::LocListEncodingString(3);
    if (pMVar2 <= (MCRegisterInfo *)SVar5.Length) {
      pMVar2 = (MCRegisterInfo *)SVar5.Length;
    }
    SVar5 = dwarf::LocListEncodingString(4);
    if (pMVar2 <= (MCRegisterInfo *)SVar5.Length) {
      pMVar2 = (MCRegisterInfo *)SVar5.Length;
    }
    SVar5 = dwarf::LocListEncodingString(5);
    if (pMVar2 <= (MCRegisterInfo *)SVar5.Length) {
      pMVar2 = (MCRegisterInfo *)SVar5.Length;
    }
    SVar5 = dwarf::LocListEncodingString(6);
    if (pMVar2 <= (MCRegisterInfo *)SVar5.Length) {
      pMVar2 = (MCRegisterInfo *)SVar5.Length;
    }
    SVar5 = dwarf::LocListEncodingString(7);
    if (pMVar2 <= (MCRegisterInfo *)SVar5.Length) {
      pMVar2 = (MCRegisterInfo *)SVar5.Length;
    }
    SVar5 = dwarf::LocListEncodingString(8);
    MRI_local = pMVar2;
    if (pMVar2 <= (MCRegisterInfo *)SVar5.Length) {
      MRI_local = (MCRegisterInfo *)SVar5.Length;
    }
    uVar3 = (ulong)local_3c;
  }
  local_a0._M_string_length = 0xc0971b;
  local_a0._M_dataplus._M_p = (pointer)&PTR_home_00e22798;
  local_a0.field_2._M_allocated_capacity = *Offset;
  raw_ostream::operator<<(OS,(format_object_base *)&local_a0);
  local_a0._M_string_length = (size_type)&local_60;
  local_a0.field_2._8_8_ = &BaseAddr_local;
  local_80 = &U;
  local_78 = &DumpOpts;
  local_70 = &Indent;
  local_68 = &MRI_local;
  F.callback = (_func_bool_intptr_t_Entry_ptr *)(uVar3 & 0xffff);
  F.callable = (intptr_t)
               function_ref<bool(llvm::DWARFDebugLoclists::Entry_const&)>::
               callback_fn<llvm::DWARFDebugLoclists::dumpLocationList(llvm::DWARFDataExtractor_const&,unsigned_long*,unsigned_short,llvm::raw_ostream&,unsigned_long,llvm::MCRegisterInfo_const*,llvm::DWARFUnit*,llvm::DIDumpOptions,unsigned_int)::__0>
  ;
  local_a0._M_dataplus._M_p = (pointer)OS;
  local_a0.field_2._M_allocated_capacity = (size_type)Data;
  visitLocationList((DWARFDataExtractor *)&local_38,(uint64_t *)Data,(uint16_t)Offset,F);
  uVar3 = (ulong)local_38 & 0xfffffffffffffffe;
  local_38 = (char *)(uVar3 != 0 | uVar3);
  if (uVar3 != 0) {
    raw_ostream::operator<<(OS,"\n");
    raw_ostream::indent(OS,Indent);
    this = raw_ostream::operator<<(OS,"error: ");
    local_48 = (ulong)local_38 | 1;
    local_38 = (char *)0x0;
    toString_abi_cxx11_(&local_a0,(llvm *)&local_48,E_00);
    raw_ostream::operator<<(this,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    if ((long *)(local_48 & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(local_48 & 0xfffffffffffffffe) + 8))();
    }
  }
  if ((long *)((ulong)local_38 & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)((ulong)local_38 & 0xfffffffffffffffe) + 8))();
  }
  return uVar3 == 0;
}

Assistant:

bool DWARFDebugLoclists::dumpLocationList(const DWARFDataExtractor &Data,
                                          uint64_t *Offset, uint16_t Version,
                                          raw_ostream &OS, uint64_t BaseAddr,
                                          const MCRegisterInfo *MRI,
                                          DWARFUnit *U, DIDumpOptions DumpOpts,
                                          unsigned Indent) {
  size_t MaxEncodingStringLength = 0;
  if (DumpOpts.Verbose) {
#define HANDLE_DW_LLE(ID, NAME)                                                \
  MaxEncodingStringLength = std::max(MaxEncodingStringLength,                  \
                                     dwarf::LocListEncodingString(ID).size());
#include "llvm/BinaryFormat/Dwarf.def"
  }

  OS << format("0x%8.8" PRIx64 ": ", *Offset);
  Error E = visitLocationList(Data, Offset, Version, [&](const Entry &E) {
    E.dump(OS, BaseAddr, Data.isLittleEndian(), Data.getAddressSize(), MRI, U,
           DumpOpts, Indent, MaxEncodingStringLength);
    return true;
  });
  if (E) {
    OS << "\n";
    OS.indent(Indent);
    OS << "error: " << toString(std::move(E));
    return false;
  }
  return true;
}